

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsFileControl(sqlite3_file *pFile,int op,void *pArg)

{
  char *pcVar1;
  sqlite3_io_methods *psVar2;
  char *zOut;
  char *zIn;
  rbu_vfs *pRbuVfs;
  sqlite3rbu *pRbu_1;
  void *dummy;
  sqlite3rbu *pRbu;
  code *pcStack_38;
  int rc;
  _func_int_sqlite3_file_ptr_int_void_ptr *xControl;
  rbu_file *p;
  void *pArg_local;
  sqlite3_file *psStack_18;
  int op_local;
  sqlite3_file *pFile_local;
  
  pcStack_38 = *(code **)(*(long *)pFile[1].pMethods + 0x50);
  xControl = (_func_int_sqlite3_file_ptr_int_void_ptr *)pFile;
  p = (rbu_file *)pArg;
  pArg_local._4_4_ = op;
  psStack_18 = pFile;
  if (op == 0x1a) {
    dummy = pArg;
    pRbu._4_4_ = (*pcStack_38)(pFile[1].pMethods,0x1a,pArg);
    if (pRbu._4_4_ == 0xc) {
      pRbu_1 = (sqlite3rbu *)0x0;
      pRbu._4_4_ = (*pcStack_38)(*(undefined8 *)(xControl + 8),0x19,&pRbu_1);
      if (pRbu._4_4_ == 0) {
        pRbu._4_4_ = 1;
        pcVar1 = sqlite3_mprintf("rbu/zipvfs setup error");
        *(char **)((long)dummy + 0x40) = pcVar1;
      }
      else if (pRbu._4_4_ == 0xc) {
        *(_func_int_sqlite3_file_ptr_int_void_ptr **)((long)dummy + 0x100) = xControl;
        *(void **)(xControl + 0x18) = dummy;
        if ((*(uint *)(xControl + 0x28) & 0x100) != 0) {
          rbuMainlistAdd((rbu_file *)xControl);
        }
        if (*(long *)(xControl + 0x50) != 0) {
          *(void **)(*(long *)(xControl + 0x50) + 0x18) = dummy;
        }
        pRbu._4_4_ = 0;
      }
    }
    pFile_local._4_4_ = pRbu._4_4_;
  }
  else {
    if (op == 0x4e9220) {
      *(int *)((long)pArg + 0x160) = *(int *)((long)pArg + 0x160) + 1;
      *(sqlite3_file **)((long)pArg + 0x168) = pFile;
      *(undefined1 *)((long)&pFile[6].pMethods + 1) = 1;
    }
    pRbu._4_4_ = (*pcStack_38)(pFile[1].pMethods,op,pArg);
    if ((pRbu._4_4_ == 0) && (pArg_local._4_4_ == 0xc)) {
      psVar2 = (sqlite3_io_methods *)
               sqlite3_mprintf("rbu(%s)/%z",*(undefined8 *)(*(long *)(xControl + 0x10) + 0x18),
                               (p->base).pMethods);
      (p->base).pMethods = psVar2;
      if (psVar2 == (sqlite3_io_methods *)0x0) {
        pRbu._4_4_ = 7;
      }
    }
    pFile_local._4_4_ = pRbu._4_4_;
  }
  return pFile_local._4_4_;
}

Assistant:

static int rbuVfsFileControl(sqlite3_file *pFile, int op, void *pArg){
  rbu_file *p = (rbu_file *)pFile;
  int (*xControl)(sqlite3_file*,int,void*) = p->pReal->pMethods->xFileControl;
  int rc;

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB)
       || p->openFlags & (SQLITE_OPEN_TRANSIENT_DB|SQLITE_OPEN_TEMP_JOURNAL)
  );
  if( op==SQLITE_FCNTL_RBU ){
    sqlite3rbu *pRbu = (sqlite3rbu*)pArg;

    /* First try to find another RBU vfs lower down in the vfs stack. If
    ** one is found, this vfs will operate in pass-through mode. The lower
    ** level vfs will do the special RBU handling.  */
    rc = xControl(p->pReal, op, pArg);

    if( rc==SQLITE_NOTFOUND ){
      /* Now search for a zipvfs instance lower down in the VFS stack. If
      ** one is found, this is an error.  */
      void *dummy = 0;
      rc = xControl(p->pReal, SQLITE_FCNTL_ZIPVFS, &dummy);
      if( rc==SQLITE_OK ){
        rc = SQLITE_ERROR;
        pRbu->zErrmsg = sqlite3_mprintf("rbu/zipvfs setup error");
      }else if( rc==SQLITE_NOTFOUND ){
        pRbu->pTargetFd = p;
        p->pRbu = pRbu;
        if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
          rbuMainlistAdd(p);
        }
        if( p->pWalFd ) p->pWalFd->pRbu = pRbu;
        rc = SQLITE_OK;
      }
    }
    return rc;
  }
  else if( op==SQLITE_FCNTL_RBUCNT ){
    sqlite3rbu *pRbu = (sqlite3rbu*)pArg;
    pRbu->nRbu++;
    pRbu->pRbuFd = p;
    p->bNolock = 1;
  }

  rc = xControl(p->pReal, op, pArg);
  if( rc==SQLITE_OK && op==SQLITE_FCNTL_VFSNAME ){
    rbu_vfs *pRbuVfs = p->pRbuVfs;
    char *zIn = *(char**)pArg;
    char *zOut = sqlite3_mprintf("rbu(%s)/%z", pRbuVfs->base.zName, zIn);
    *(char**)pArg = zOut;
    if( zOut==0 ) rc = SQLITE_NOMEM;
  }

  return rc;
}